

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [24];
  undefined1 (*pauVar4) [16];
  float fVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [24];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  undefined8 *puVar27;
  int iVar28;
  long *in_RSI;
  long *in_RDI;
  __m128 _p128_3;
  __m256 _p256_3;
  __m256 _slope256_3;
  __m128 _slope128_3;
  float slope_3;
  int i_7;
  float *ptr_3;
  int q;
  int size_2;
  __m128 _p128_2;
  __m256 _p256_2;
  __m256 _slope256_2;
  __m128 _slope128_2;
  float slope_2;
  int j;
  float *ptr_2;
  int i_6;
  int size_1;
  int i_5;
  __m128 _slope128_1;
  __m128 _p128_1;
  int i_4;
  int ii_3;
  __m256 _slope256_1;
  __m256 _p256_1;
  int i_3;
  int ii_2;
  int remain_size_start_1;
  int nn_size_1;
  float slope_1;
  float *ptr_1;
  int i_2;
  __m128 _slope128;
  __m128 _p128;
  int i_1;
  int ii_1;
  __m256 _slope256;
  __m256 _p256;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  float *slope;
  float *ptr;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  __m256 neg_6;
  __m256 pos_6;
  __m256 neg_4;
  __m256 pos_4;
  __m256 neg_2;
  __m256 pos_2;
  __m256 neg;
  __m256 pos;
  __m128 neg_7;
  __m128 pos_7;
  __m128 neg_5;
  __m128 pos_5;
  __m128 neg_3;
  __m128 pos_3;
  __m128 neg_1;
  __m128 pos_1;
  Mat *m;
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  float local_122c;
  undefined1 local_1200 [32];
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  int local_1138;
  undefined1 (*local_10e0) [32];
  int local_10d8;
  int local_106c;
  undefined1 (*local_1068) [32];
  int local_105c;
  int local_1054;
  int local_1024;
  int local_fd0;
  int local_fb4;
  int local_f84;
  int local_f24;
  ulong uStack_758;
  ulong uStack_718;
  ulong uStack_6d8;
  ulong uStack_698;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  ulong uStack_2e8;
  ulong uStack_2c8;
  ulong uStack_2a8;
  ulong uStack_288;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  
  iVar26 = (int)in_RSI[5];
  iVar6 = *(int *)((long)in_RSI + 0x2c);
  lVar23 = in_RSI[6];
  lVar24 = in_RSI[7];
  iVar7 = (int)in_RSI[3];
  if (iVar26 == 1) {
    iVar28 = iVar6 * iVar7;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
      lVar8 = *in_RSI;
      fVar5 = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      for (local_fd0 = 0; local_fd0 < iVar28 / 8; local_fd0 = local_fd0 + 1) {
        pauVar2 = (undefined1 (*) [32])(lVar8 + (long)(local_fd0 * 8) * 4);
        auVar10 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
        auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar5),0x20);
        auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar5),0x30);
        auVar12 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
        auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar5),0x20);
        auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar5),0x30);
        puVar27 = (undefined8 *)(lVar8 + (long)(local_fd0 * 8) * 4);
        uStack_718 = SUB328(ZEXT832(0),4);
        auVar11 = vmaxps_avx(ZEXT832(uStack_718) << 0x40,*pauVar2);
        auVar13 = vminps_avx(ZEXT832(uStack_718) << 0x40,*pauVar2);
        local_420 = auVar10._0_4_;
        fStack_41c = auVar10._4_4_;
        fStack_418 = auVar10._8_4_;
        fStack_414 = auVar10._12_4_;
        fStack_410 = auVar12._0_4_;
        fStack_40c = auVar12._4_4_;
        fStack_408 = auVar12._8_4_;
        fStack_404 = auVar12._12_4_;
        local_440 = auVar13._0_4_;
        fStack_43c = auVar13._4_4_;
        fStack_438 = auVar13._8_4_;
        fStack_434 = auVar13._12_4_;
        fStack_430 = auVar13._16_4_;
        fStack_42c = auVar13._20_4_;
        fStack_428 = auVar13._24_4_;
        local_520 = auVar11._0_4_;
        fStack_51c = auVar11._4_4_;
        fStack_518 = auVar11._8_4_;
        fStack_514 = auVar11._12_4_;
        fStack_510 = auVar11._16_4_;
        fStack_50c = auVar11._20_4_;
        fStack_508 = auVar11._24_4_;
        fStack_504 = auVar11._28_4_;
        *puVar27 = CONCAT44(fStack_51c + fStack_41c * fStack_43c,local_520 + local_420 * local_440);
        puVar27[1] = CONCAT44(fStack_514 + fStack_414 * fStack_434,
                              fStack_518 + fStack_418 * fStack_438);
        puVar27[2] = CONCAT44(fStack_50c + fStack_40c * fStack_42c,
                              fStack_510 + fStack_410 * fStack_430);
        puVar27[3] = CONCAT44(fStack_504 + fStack_404,fStack_508 + fStack_408 * fStack_428);
      }
      local_1054 = (iVar28 / 8) * 8;
      iVar25 = (iVar28 % 8) / 4;
      for (local_1024 = 0; local_1024 < iVar25; local_1024 = local_1024 + 1) {
        iVar1 = local_1054 + local_1024 * 4;
        pauVar4 = (undefined1 (*) [16])(lVar8 + (long)iVar1 * 4);
        puVar27 = (undefined8 *)(lVar8 + (long)iVar1 * 4);
        uStack_2c8 = SUB168(ZEXT816(0),4);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uStack_2c8;
        auVar10 = vmaxps_avx(auVar10 << 0x40,*pauVar4);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uStack_2c8;
        auVar12 = vminps_avx(auVar12 << 0x40,*pauVar4);
        local_160 = auVar12._0_4_;
        fStack_15c = auVar12._4_4_;
        fStack_158 = auVar12._8_4_;
        fStack_154 = auVar12._12_4_;
        local_1d0 = auVar10._0_4_;
        fStack_1cc = auVar10._4_4_;
        fStack_1c8 = auVar10._8_4_;
        fStack_1c4 = auVar10._12_4_;
        *puVar27 = CONCAT44(fStack_1cc + fVar5 * fStack_15c,local_1d0 + fVar5 * local_160);
        puVar27[1] = CONCAT44(fStack_1c4 + fVar5 * fStack_154,fStack_1c8 + fVar5 * fStack_158);
      }
      for (local_1054 = iVar25 * 4 + local_1054; local_1054 < iVar28; local_1054 = local_1054 + 1) {
        if (*(float *)(lVar8 + (long)local_1054 * 4) < 0.0) {
          *(float *)(lVar8 + (long)local_1054 * 4) =
               fVar5 * *(float *)(lVar8 + (long)local_1054 * 4);
        }
      }
    }
    else {
      lVar8 = *in_RSI;
      lVar9 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      for (local_f24 = 0; local_f24 < iVar28 / 8; local_f24 = local_f24 + 1) {
        iVar25 = local_f24 * 8;
        pauVar2 = (undefined1 (*) [32])(lVar8 + (long)iVar25 * 4);
        pauVar3 = (undefined1 (*) [24])(lVar9 + (long)iVar25 * 4);
        auVar16 = *pauVar3;
        uVar14 = *(undefined8 *)pauVar3[1];
        puVar27 = (undefined8 *)(lVar8 + (long)iVar25 * 4);
        uStack_758 = SUB328(ZEXT832(0),4);
        auVar11 = vmaxps_avx(ZEXT832(uStack_758) << 0x40,*pauVar2);
        auVar13 = vminps_avx(ZEXT832(uStack_758) << 0x40,*pauVar2);
        local_460 = auVar16._0_4_;
        fStack_45c = auVar16._4_4_;
        fStack_458 = auVar16._8_4_;
        fStack_454 = auVar16._12_4_;
        fStack_450 = auVar16._16_4_;
        fStack_44c = auVar16._20_4_;
        fStack_448 = (float)uVar14;
        fStack_444 = (float)((ulong)uVar14 >> 0x20);
        local_480 = auVar13._0_4_;
        fStack_47c = auVar13._4_4_;
        fStack_478 = auVar13._8_4_;
        fStack_474 = auVar13._12_4_;
        fStack_470 = auVar13._16_4_;
        fStack_46c = auVar13._20_4_;
        fStack_468 = auVar13._24_4_;
        local_560 = auVar11._0_4_;
        fStack_55c = auVar11._4_4_;
        fStack_558 = auVar11._8_4_;
        fStack_554 = auVar11._12_4_;
        fStack_550 = auVar11._16_4_;
        fStack_54c = auVar11._20_4_;
        fStack_548 = auVar11._24_4_;
        fStack_544 = auVar11._28_4_;
        *puVar27 = CONCAT44(fStack_55c + fStack_45c * fStack_47c,local_560 + local_460 * local_480);
        puVar27[1] = CONCAT44(fStack_554 + fStack_454 * fStack_474,
                              fStack_558 + fStack_458 * fStack_478);
        puVar27[2] = CONCAT44(fStack_54c + fStack_44c * fStack_46c,
                              fStack_550 + fStack_450 * fStack_470);
        puVar27[3] = CONCAT44(fStack_544 + fStack_444,fStack_548 + fStack_448 * fStack_468);
      }
      local_fb4 = (iVar28 / 8) * 8;
      iVar25 = (iVar28 % 8) / 4;
      for (local_f84 = 0; local_f84 < iVar25; local_f84 = local_f84 + 1) {
        iVar1 = local_fb4 + local_f84 * 4;
        pauVar4 = (undefined1 (*) [16])(lVar8 + (long)iVar1 * 4);
        puVar27 = (undefined8 *)(lVar9 + (long)iVar1 * 4);
        uVar14 = *puVar27;
        uVar15 = puVar27[1];
        puVar27 = (undefined8 *)(lVar8 + (long)iVar1 * 4);
        uStack_2e8 = SUB168(ZEXT816(0),4);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uStack_2e8;
        auVar10 = vmaxps_avx(auVar17 << 0x40,*pauVar4);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uStack_2e8;
        auVar12 = vminps_avx(auVar18 << 0x40,*pauVar4);
        local_170 = (float)uVar14;
        fStack_16c = (float)((ulong)uVar14 >> 0x20);
        fStack_168 = (float)uVar15;
        fStack_164 = (float)((ulong)uVar15 >> 0x20);
        local_180 = auVar12._0_4_;
        fStack_17c = auVar12._4_4_;
        fStack_178 = auVar12._8_4_;
        fStack_174 = auVar12._12_4_;
        local_1f0 = auVar10._0_4_;
        fStack_1ec = auVar10._4_4_;
        fStack_1e8 = auVar10._8_4_;
        fStack_1e4 = auVar10._12_4_;
        *puVar27 = CONCAT44(fStack_1ec + fStack_16c * fStack_17c,local_1f0 + local_170 * local_180);
        puVar27[1] = CONCAT44(fStack_1e4 + fStack_164 * fStack_174,
                              fStack_1e8 + fStack_168 * fStack_178);
      }
      for (local_fb4 = iVar25 * 4 + local_fb4; local_fb4 < iVar28; local_fb4 = local_fb4 + 1) {
        if (*(float *)(lVar8 + (long)local_fb4 * 4) < 0.0) {
          *(float *)(lVar8 + (long)local_fb4 * 4) =
               *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                         (long)local_fb4 * 4) * *(float *)(lVar8 + (long)local_fb4 * 4);
        }
      }
    }
  }
  if (iVar26 == 2) {
    iVar28 = iVar6 * iVar7;
    for (local_105c = 0; local_105c < (int)lVar23; local_105c = local_105c + 1) {
      local_1068 = (undefined1 (*) [32])
                   (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_105c * in_RSI[2]);
      local_106c = 0;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        local_11c0 = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      }
      else {
        local_11c0 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                               (long)local_105c * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar7 != 4)) {
        local_11d0 = CONCAT44(local_11c0,local_11c0);
        uStack_11c8 = CONCAT44(local_11c0,local_11c0);
      }
      else {
        puVar27 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  (long)(local_105c << 2) * 4);
        local_11d0 = *puVar27;
        uStack_11c8 = puVar27[1];
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar7 != 8)) {
        local_1200._8_8_ = uStack_11c8;
        local_1200._0_8_ = local_11d0;
        local_1200._24_8_ = uStack_11c8;
        local_1200._16_8_ = local_11d0;
      }
      else {
        local_1200 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_105c << 3) * 4);
      }
      for (; local_106c + 7 < iVar28; local_106c = local_106c + 8) {
        uStack_6d8 = SUB328(ZEXT832(0),4);
        auVar11 = vmaxps_avx(ZEXT832(uStack_6d8) << 0x40,*local_1068);
        auVar13 = vminps_avx(ZEXT832(uStack_6d8) << 0x40,*local_1068);
        local_3e0 = local_1200._0_4_;
        fStack_3dc = local_1200._4_4_;
        fStack_3d8 = local_1200._8_4_;
        fStack_3d4 = local_1200._12_4_;
        fStack_3d0 = local_1200._16_4_;
        fStack_3cc = local_1200._20_4_;
        fStack_3c8 = local_1200._24_4_;
        fStack_3c4 = local_1200._28_4_;
        local_400 = auVar13._0_4_;
        fStack_3fc = auVar13._4_4_;
        fStack_3f8 = auVar13._8_4_;
        fStack_3f4 = auVar13._12_4_;
        fStack_3f0 = auVar13._16_4_;
        fStack_3ec = auVar13._20_4_;
        fStack_3e8 = auVar13._24_4_;
        local_4e0 = auVar11._0_4_;
        fStack_4dc = auVar11._4_4_;
        fStack_4d8 = auVar11._8_4_;
        fStack_4d4 = auVar11._12_4_;
        fStack_4d0 = auVar11._16_4_;
        fStack_4cc = auVar11._20_4_;
        fStack_4c8 = auVar11._24_4_;
        fStack_4c4 = auVar11._28_4_;
        *(ulong *)*local_1068 =
             CONCAT44(fStack_4dc + fStack_3dc * fStack_3fc,local_4e0 + local_3e0 * local_400);
        *(ulong *)(*local_1068 + 8) =
             CONCAT44(fStack_4d4 + fStack_3d4 * fStack_3f4,fStack_4d8 + fStack_3d8 * fStack_3f8);
        *(ulong *)(*local_1068 + 0x10) =
             CONCAT44(fStack_4cc + fStack_3cc * fStack_3ec,fStack_4d0 + fStack_3d0 * fStack_3f0);
        *(ulong *)(*local_1068 + 0x18) =
             CONCAT44(fStack_4c4 + fStack_3c4,fStack_4c8 + fStack_3c8 * fStack_3e8);
        local_1068 = local_1068 + 1;
      }
      for (; local_106c + 3 < iVar28; local_106c = local_106c + 4) {
        uStack_2a8 = SUB168(ZEXT816(0),4);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uStack_2a8;
        auVar10 = vmaxps_avx(auVar19 << 0x40,*(undefined1 (*) [16])*local_1068);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uStack_2a8;
        auVar12 = vminps_avx(auVar20 << 0x40,*(undefined1 (*) [16])*local_1068);
        local_130 = (float)local_11d0;
        fStack_12c = (float)((ulong)local_11d0 >> 0x20);
        fStack_128 = (float)uStack_11c8;
        fStack_124 = (float)((ulong)uStack_11c8 >> 0x20);
        local_140 = auVar12._0_4_;
        fStack_13c = auVar12._4_4_;
        fStack_138 = auVar12._8_4_;
        fStack_134 = auVar12._12_4_;
        local_1b0 = auVar10._0_4_;
        fStack_1ac = auVar10._4_4_;
        fStack_1a8 = auVar10._8_4_;
        fStack_1a4 = auVar10._12_4_;
        *(ulong *)*local_1068 =
             CONCAT44(fStack_1ac + fStack_12c * fStack_13c,local_1b0 + local_130 * local_140);
        *(ulong *)(*local_1068 + 8) =
             CONCAT44(fStack_1a4 + fStack_124 * fStack_134,fStack_1a8 + fStack_128 * fStack_138);
        local_1068 = (undefined1 (*) [32])(*local_1068 + 0x10);
      }
      for (; local_106c < iVar28; local_106c = local_106c + 1) {
        if (*(float *)*local_1068 < 0.0) {
          *(float *)*local_1068 = local_11c0 * *(float *)*local_1068;
        }
        local_1068 = (undefined1 (*) [32])(*local_1068 + 4);
      }
    }
  }
  if (iVar26 == 3) {
    iVar26 = iVar6 * (int)lVar23 * iVar7;
    for (local_10d8 = 0; local_10d8 < (int)lVar24; local_10d8 = local_10d8 + 1) {
      local_10e0 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_10d8 * in_RSI[2]);
      local_1138 = 0;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        local_122c = **(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      }
      else {
        local_122c = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                               (long)local_10d8 * 4);
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar7 != 4)) {
        local_1240 = CONCAT44(local_122c,local_122c);
        uStack_1238 = CONCAT44(local_122c,local_122c);
      }
      else {
        puVar27 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  (long)(local_10d8 << 2) * 4);
        local_1240 = *puVar27;
        uStack_1238 = puVar27[1];
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) || (iVar7 != 8)) {
        local_1260._8_8_ = uStack_1238;
        local_1260._0_8_ = local_1240;
        local_1260._24_8_ = uStack_1238;
        local_1260._16_8_ = local_1240;
      }
      else {
        local_1260 = *(undefined1 (*) [32])
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      (long)(local_10d8 << 3) * 4);
      }
      for (; local_1138 + 7 < iVar26; local_1138 = local_1138 + 8) {
        uStack_698 = SUB328(ZEXT832(0),4);
        auVar11 = vmaxps_avx(ZEXT832(uStack_698) << 0x40,*local_10e0);
        auVar13 = vminps_avx(ZEXT832(uStack_698) << 0x40,*local_10e0);
        local_3a0 = local_1260._0_4_;
        fStack_39c = local_1260._4_4_;
        fStack_398 = local_1260._8_4_;
        fStack_394 = local_1260._12_4_;
        fStack_390 = local_1260._16_4_;
        fStack_38c = local_1260._20_4_;
        fStack_388 = local_1260._24_4_;
        fStack_384 = local_1260._28_4_;
        local_3c0 = auVar13._0_4_;
        fStack_3bc = auVar13._4_4_;
        fStack_3b8 = auVar13._8_4_;
        fStack_3b4 = auVar13._12_4_;
        fStack_3b0 = auVar13._16_4_;
        fStack_3ac = auVar13._20_4_;
        fStack_3a8 = auVar13._24_4_;
        local_4a0 = auVar11._0_4_;
        fStack_49c = auVar11._4_4_;
        fStack_498 = auVar11._8_4_;
        fStack_494 = auVar11._12_4_;
        fStack_490 = auVar11._16_4_;
        fStack_48c = auVar11._20_4_;
        fStack_488 = auVar11._24_4_;
        fStack_484 = auVar11._28_4_;
        *(ulong *)*local_10e0 =
             CONCAT44(fStack_49c + fStack_39c * fStack_3bc,local_4a0 + local_3a0 * local_3c0);
        *(ulong *)(*local_10e0 + 8) =
             CONCAT44(fStack_494 + fStack_394 * fStack_3b4,fStack_498 + fStack_398 * fStack_3b8);
        *(ulong *)(*local_10e0 + 0x10) =
             CONCAT44(fStack_48c + fStack_38c * fStack_3ac,fStack_490 + fStack_390 * fStack_3b0);
        *(ulong *)(*local_10e0 + 0x18) =
             CONCAT44(fStack_484 + fStack_384,fStack_488 + fStack_388 * fStack_3a8);
        local_10e0 = local_10e0 + 1;
      }
      for (; local_1138 + 3 < iVar26; local_1138 = local_1138 + 4) {
        uStack_288 = SUB168(ZEXT816(0),4);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uStack_288;
        auVar10 = vmaxps_avx(auVar21 << 0x40,*(undefined1 (*) [16])*local_10e0);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uStack_288;
        auVar12 = vminps_avx(auVar22 << 0x40,*(undefined1 (*) [16])*local_10e0);
        local_110 = (float)local_1240;
        fStack_10c = (float)((ulong)local_1240 >> 0x20);
        fStack_108 = (float)uStack_1238;
        fStack_104 = (float)((ulong)uStack_1238 >> 0x20);
        local_120 = auVar12._0_4_;
        fStack_11c = auVar12._4_4_;
        fStack_118 = auVar12._8_4_;
        fStack_114 = auVar12._12_4_;
        local_190 = auVar10._0_4_;
        fStack_18c = auVar10._4_4_;
        fStack_188 = auVar10._8_4_;
        fStack_184 = auVar10._12_4_;
        *(ulong *)*local_10e0 =
             CONCAT44(fStack_18c + fStack_10c * fStack_11c,local_190 + local_110 * local_120);
        *(ulong *)(*local_10e0 + 8) =
             CONCAT44(fStack_184 + fStack_104 * fStack_114,fStack_188 + fStack_108 * fStack_118);
        local_10e0 = (undefined1 (*) [32])(*local_10e0 + 0x10);
      }
      for (; local_1138 < iVar26; local_1138 = local_1138 + 1) {
        if (*(float *)*local_10e0 < 0.0) {
          *(float *)*local_10e0 = local_122c * *(float *)*local_10e0;
        }
        local_10e0 = (undefined1 (*) [32])(*local_10e0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}